

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.cpp
# Opt level: O0

Variable __thiscall
LiteScript::_Type_CALLBACK::ONotEqual(_Type_CALLBACK *this,Variable *obj1,Variable *obj2)

{
  bool bVar1;
  Object *pOVar2;
  Type *this_00;
  Type *t;
  Callback *this_01;
  Callback *c;
  bool *pbVar3;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  uint *extraout_RDX;
  Variable VVar4;
  bool local_72;
  Variable *obj2_local;
  Variable *obj1_local;
  _Type_CALLBACK *this_local;
  Variable *result;
  
  pOVar2 = Variable::operator->(obj2);
  Memory::Create((Memory *)this,(Type *)pOVar2->memory);
  pOVar2 = Variable::operator->(obj2);
  this_00 = Object::GetType(pOVar2);
  pOVar2 = Variable::operator->((Variable *)CONCAT71(in_register_00000009,in_CL));
  t = Object::GetType(pOVar2);
  bVar1 = Type::operator==(this_00,t);
  local_72 = false;
  if (bVar1) {
    pOVar2 = Variable::operator->(obj2);
    this_01 = Object::GetData<LiteScript::Callback>(pOVar2);
    pOVar2 = Variable::operator->((Variable *)CONCAT71(in_register_00000009,in_CL));
    c = Object::GetData<LiteScript::Callback>(pOVar2);
    local_72 = Callback::operator!=(this_01,c);
  }
  pOVar2 = Variable::operator->((Variable *)this);
  pbVar3 = Object::GetData<bool>(pOVar2);
  *pbVar3 = local_72;
  VVar4.nb_ref = extraout_RDX;
  VVar4.obj = (Object *)this;
  return VVar4;
}

Assistant:

LiteScript::Variable LiteScript::_Type_CALLBACK::ONotEqual(const Variable &obj1, const Variable &obj2) const {
    Variable result = obj1->memory.Create(Type::BOOLEAN);
    result->GetData<bool>() = (obj1->GetType() == obj2->GetType() && obj1->GetData<Callback>() != obj2->GetData<Callback>());
    return result;
}